

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::ProcessEvents(CGameClient *this)

{
  int iVar1;
  IClient *pIVar2;
  vec2 Pos;
  CGameClient *in_RDI;
  long in_FS_OFFSET;
  vec2 in_stack_00000038;
  CNetEvent_SoundWorld *ev_5;
  CNetEvent_Death *ev_4;
  CNetEvent_Spawn *ev_3;
  CNetEvent_HammerHit *ev_2;
  CNetEvent_Explosion *ev_1;
  CNetEvent_Damage *ev;
  void *pData;
  int Index;
  int Num;
  int SnapType;
  vec2 in_stack_000000a8;
  CSnapItem Item;
  float Vol;
  int in_stack_ffffffffffffff30;
  int Chn;
  CEffects *in_stack_ffffffffffffff38;
  vec2 in_stack_ffffffffffffff40;
  CEffects *in_stack_ffffffffffffff50;
  CEffects *in_stack_ffffffffffffff58;
  vec2 in_stack_ffffffffffffff68;
  vec2 in_stack_ffffffffffffff70;
  vec2 in_stack_ffffffffffffff78;
  uint local_5c;
  vec2 in_stack_ffffffffffffffb8;
  vector2_base<float> local_3c;
  vector2_base<float> local_34;
  vector2_base<float> local_2c;
  vector2_base<float> local_24;
  vector2_base<float> local_1c;
  int local_14 [3];
  long local_8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 extraout_var;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_SuppressEvents & 1U) == 0) {
    pIVar2 = Client(in_RDI);
    iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x1e])(pIVar2,0);
    for (local_5c = 0; (int)local_5c < iVar1; local_5c = local_5c + 1) {
      pIVar2 = Client(in_RDI);
      Pos.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)
                    (*(pIVar2->super_IInterface)._vptr_IInterface[0x20])
                              (pIVar2,0,(ulong)local_5c,local_14);
      Pos.field_1.y = extraout_var.y;
      if (local_14[0] == 0x16) {
        in_stack_ffffffffffffff58 = in_RDI->m_pEffects;
        vector2_base<float>::vector2_base
                  (&local_1c,(float)*(int *)Pos,(float)*(int *)((long)Pos + 4));
        CEffects::DamageIndicator
                  ((CEffects *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                   (int)in_stack_ffffffffffffff68.field_1,in_stack_ffffffffffffff68.field_0.x,
                   (int)((ulong)in_RDI >> 0x20));
      }
      else if (local_14[0] == 0x11) {
        in_stack_ffffffffffffff50 = in_RDI->m_pEffects;
        vector2_base<float>::vector2_base
                  (&local_24,(float)*(int *)Pos,(float)*(int *)((long)Pos + 4));
        CEffects::Explosion((CEffects *)Pos,in_stack_000000a8);
      }
      else if (local_14[0] == 0x13) {
        vector2_base<float>::vector2_base
                  (&local_2c,(float)*(int *)Pos,(float)*(int *)((long)Pos + 4));
        CEffects::HammerHit(in_stack_ffffffffffffff38,Pos);
      }
      else if (local_14[0] == 0x12) {
        in_stack_ffffffffffffff40 = (vec2)in_RDI->m_pEffects;
        vector2_base<float>::vector2_base
                  (&local_34,(float)*(int *)Pos,(float)*(int *)((long)Pos + 4));
        CEffects::PlayerSpawn(in_stack_ffffffffffffff38,in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffff78 = Pos;
      }
      else if (local_14[0] == 0x14) {
        in_stack_ffffffffffffff38 = in_RDI->m_pEffects;
        vector2_base<float>::vector2_base
                  (&local_3c,(float)*(int *)Pos,(float)*(int *)((long)Pos + 4));
        CEffects::PlayerDeath
                  (in_stack_ffffffffffffff58,in_stack_00000038,
                   (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        in_stack_ffffffffffffff70 = Pos;
      }
      else if (local_14[0] == 0x15) {
        Vol = (float)((ulong)in_RDI->m_pSounds >> 0x20);
        Chn = *(int *)((long)Pos + 8);
        vector2_base<float>::vector2_base
                  ((vector2_base<float> *)&stack0xffffffffffffffbc,(float)*(int *)Pos,
                   (float)*(int *)((long)Pos + 4));
        CSounds::PlayAt((CSounds *)in_stack_ffffffffffffff38,Chn,in_stack_ffffffffffffff30,Vol,
                        in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff68 = Pos;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::ProcessEvents()
{
	if(m_SuppressEvents)
		return;

	int SnapType = IClient::SNAP_CURRENT;
	int Num = Client()->SnapNumItems(SnapType);
	for(int Index = 0; Index < Num; Index++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(SnapType, Index, &Item);

		if(Item.m_Type == NETEVENTTYPE_DAMAGE)
		{
			CNetEvent_Damage *ev = (CNetEvent_Damage *)pData;
			m_pEffects->DamageIndicator(vec2(ev->m_X, ev->m_Y), ev->m_HealthAmount + ev->m_ArmorAmount, ev->m_Angle / 256.0f, ev->m_ClientID);
		}
		else if(Item.m_Type == NETEVENTTYPE_EXPLOSION)
		{
			CNetEvent_Explosion *ev = (CNetEvent_Explosion *)pData;
			m_pEffects->Explosion(vec2(ev->m_X, ev->m_Y));
		}
		else if(Item.m_Type == NETEVENTTYPE_HAMMERHIT)
		{
			CNetEvent_HammerHit *ev = (CNetEvent_HammerHit *)pData;
			m_pEffects->HammerHit(vec2(ev->m_X, ev->m_Y));
		}
		else if(Item.m_Type == NETEVENTTYPE_SPAWN)
		{
			CNetEvent_Spawn *ev = (CNetEvent_Spawn *)pData;
			m_pEffects->PlayerSpawn(vec2(ev->m_X, ev->m_Y));
		}
		else if(Item.m_Type == NETEVENTTYPE_DEATH)
		{
			CNetEvent_Death *ev = (CNetEvent_Death *)pData;
			m_pEffects->PlayerDeath(vec2(ev->m_X, ev->m_Y), ev->m_ClientID);
		}
		else if(Item.m_Type == NETEVENTTYPE_SOUNDWORLD)
		{
			CNetEvent_SoundWorld *ev = (CNetEvent_SoundWorld *)pData;
			m_pSounds->PlayAt(CSounds::CHN_WORLD, ev->m_SoundID, 1.0f, vec2(ev->m_X, ev->m_Y));
		}
	}
}